

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O2

bool test_Player_reinforce(bool verbose)

{
  int iVar1;
  Hand *pHVar2;
  pointer ppCVar3;
  Country *this;
  int iVar4;
  GameLoop *pGVar5;
  reference ppPVar6;
  reference ppCVar7;
  ostream *poVar8;
  undefined7 in_register_00000039;
  pointer ppCVar9;
  undefined4 uVar10;
  string local_50;
  
  GameLoop::startSingle(true);
  pGVar5 = GameLoop::getInstance();
  ppPVar6 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar5->allPlayers,0);
  pHVar2 = (*ppPVar6)->pCards;
  uVar10 = 2;
  local_50._M_dataplus._M_p._0_4_ = uVar10;
  std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
            (pHVar2->handPointer,(CardType *)&local_50);
  local_50._M_dataplus._M_p._0_4_ = uVar10;
  std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
            (pHVar2->handPointer,(CardType *)&local_50);
  local_50._M_dataplus._M_p._0_4_ = uVar10;
  std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
            (pHVar2->handPointer,(CardType *)&local_50);
  local_50._M_dataplus._M_p._0_4_ = uVar10;
  std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
            (pHVar2->handPointer,(CardType *)&local_50);
  local_50._M_dataplus._M_p._0_4_ = uVar10;
  std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
            (pHVar2->handPointer,(CardType *)&local_50);
  pGVar5 = GameLoop::getInstance();
  ppPVar6 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar5->allPlayers,0);
  ppCVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                      ((*ppPVar6)->pOwnedCountries,0);
  iVar1 = *(*ppCVar7)->pNumberOfTroops;
  pGVar5 = GameLoop::getInstance();
  ppPVar6 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar5->allPlayers,0);
  iVar4 = Player::reinforce(*ppPVar6);
  if ((int)CONCAT71(in_register_00000039,verbose) != 0) {
    pGVar5 = GameLoop::getInstance();
    ppPVar6 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar5->allPlayers,0);
    ppCVar3 = ((*ppPVar6)->pOwnedCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar9 = ((*ppPVar6)->pOwnedCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppCVar9 != ppCVar3; ppCVar9 = ppCVar9 + 1) {
      this = *ppCVar9;
      std::operator<<((ostream *)&std::cout,"\x1b[35m");
      poVar8 = std::operator<<((ostream *)&std::cout,"player1\'s ");
      Map::Country::getCountryName_abi_cxx11_(&local_50,this);
      poVar8 = std::operator<<(poVar8,(string *)&local_50);
      poVar8 = std::operator<<(poVar8," had ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar1);
      poVar8 = std::operator<<(poVar8," armies");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_50);
      poVar8 = std::operator<<((ostream *)&std::cout,"player1\'s ");
      Map::Country::getCountryName_abi_cxx11_(&local_50,this);
      poVar8 = std::operator<<(poVar8,(string *)&local_50);
      poVar8 = std::operator<<(poVar8," now has ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*this->pNumberOfTroops);
      poVar8 = std::operator<<(poVar8," armies");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator<<((ostream *)&std::cout,"\x1b[31m");
    }
  }
  GameLoop::resetInstance();
  return iVar4 != -1;
}

Assistant:

bool test_Player_reinforce(bool verbose = false) {

    // Arrange
    bool success = true;
    GameLoop::startSingle(true);
    Hand* pHand = GameLoop::getInstance()->getAllPlayers()->at(0)->getCards();
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);

    int numArmiesC1 = GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0)->getNumberOfTroops();

    if (GameLoop::getInstance()->getAllPlayers()->at(0)->reinforce() == PlayerAction::FAILED) {
        success = false;
    }

    if (verbose) {
        for (auto* c: *GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()) {
            std::cout << "\033[35m";
            std::cout << "player1's " << c->getCountryName() << " had " << numArmiesC1 << " armies" << std::endl;
            std::cout << "player1's " << c->getCountryName() << " now has " << c->getNumberOfTroops()
                      << " armies" << std::endl;
            std::cout << "\033[31m";
        }
    }
    GameLoop::resetInstance();
    return success;
}